

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.hpp
# Opt level: O2

void __thiscall
pg::Solvers::_add(Solvers *this,string *id,string *description,bool isParallel,
                 SolverConstructor *constructor)

{
  mapped_type *this_00;
  SolverInfo local_70;
  
  std::__cxx11::string::string((string *)&local_70,(string *)description);
  local_70.isParallel = isParallel;
  std::
  function<std::unique_ptr<pg::Solver,_std::default_delete<pg::Solver>_>_(pg::Oink_&,_pg::Game_&)>::
  function(&local_70.constructor,constructor);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pg::Solvers::SolverInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pg::Solvers::SolverInfo>_>_>
            ::operator[](&this->solvers,id);
  SolverInfo::operator=(this_00,&local_70);
  SolverInfo::~SolverInfo(&local_70);
  return;
}

Assistant:

void _add(const std::string& id, const std::string& description, bool isParallel, const SolverConstructor& constructor)
    {
        solvers[id] = {description, isParallel, constructor};
    }